

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O1

void freedynamicdata(void)

{
  level *lev;
  trap *ptVar1;
  damage *pdVar2;
  fruit *pfVar3;
  trap *__ptr;
  damage *__ptr_00;
  fruit *__ptr_01;
  nh_autopickup_rules *__ptr_02;
  nh_msgtype_rules *__ptr_03;
  long lVar4;
  
  if (objects != (objclass *)0x0) {
    unload_qtlist();
    free_invbuf();
    free_youbuf();
    lVar4 = 0;
    tmp_at(-7,0);
    do {
      lev = levels[lVar4];
      levels[lVar4] = (level *)0x0;
      if (lev != (level *)0x0) {
        dmonsfree(lev);
        free_timers(lev);
        free_light_sources(lev);
        free_monchn(lev->monlist);
        free_worm(lev);
        __ptr = lev->lev_traps;
        while (__ptr != (trap *)0x0) {
          ptVar1 = __ptr->ntrap;
          free(__ptr);
          __ptr = ptVar1;
        }
        free_objchn(lev->objlist);
        free_objchn(lev->buriedobjlist);
        free_objchn(lev->billobjs);
        free_engravings(lev);
        __ptr_00 = lev->damagelist;
        while (__ptr_00 != (damage *)0x0) {
          pdVar2 = __ptr_00->next;
          free(__ptr_00);
          __ptr_00 = pdVar2;
        }
        lev->damagelist = (damage *)0x0;
        free(lev);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x200);
    free_objchn(invent);
    free_objchn(magic_chest_objs);
    free_monchn(migrating_mons);
    free_monchn(mydogs);
    mon_animal_list('\0');
    free_oracles();
    __ptr_01 = ffruit;
    while (__ptr_01 != (fruit *)0x0) {
      pfVar3 = __ptr_01->nextf;
      free(__ptr_01);
      __ptr_01 = pfVar3;
    }
    ffruit = (fruit *)0x0;
    freenames();
    free_waterlevel();
    free_dungeon();
    free_history();
    if (iflags.ap_rules != (nh_autopickup_rules *)0x0) {
      free((iflags.ap_rules)->rules);
      __ptr_02 = iflags.ap_rules;
      (iflags.ap_rules)->rules = (nh_autopickup_rule *)0x0;
      free(__ptr_02);
    }
    iflags.ap_rules = (nh_autopickup_rules *)0x0;
    if (iflags.mt_rules != (nh_msgtype_rules *)0x0) {
      free((iflags.mt_rules)->rules);
      __ptr_03 = iflags.mt_rules;
      (iflags.mt_rules)->rules = (nh_msgtype_rule *)0x0;
      free(__ptr_03);
      iflags.mt_rules = (nh_msgtype_rules *)0x0;
    }
    if (iflags.hp_notify_fmt != (char *)0x0) {
      free(iflags.hp_notify_fmt);
      iflags.hp_notify_fmt = (char *)0x0;
    }
    free(artilist);
    free(objects);
    objects = (objclass *)0x0;
    artilist = (artifact *)0x0;
    if (active_birth_options != (nh_option_desc *)0x0) {
      free_optlist(active_birth_options);
    }
    active_birth_options = (nh_option_desc *)0x0;
  }
  return;
}

Assistant:

void freedynamicdata(void)
{
	int i;
	struct level *lev;
	
	if (!objects)
	    return; /* no cleanup necessary */
	
	unload_qtlist();
	free_invbuf();	/* let_to_name (invent.c) */
	free_youbuf();	/* You_buf,&c (pline.c) */
	tmp_at(DISP_FREEMEM, 0);	/* temporary display effects */
# define free_animals()	 mon_animal_list(FALSE)

	for (i = 0; i < MAXLINFO; i++) {
	    lev = levels[i];
	    levels[i] = NULL;
	    if (!lev) continue;
	    
	    /* level-specific data */
	    dmonsfree(lev);	/* release dead monsters */
	    free_timers(lev);
	    free_light_sources(lev);
	    free_monchn(lev->monlist);
	    free_worm(lev);		/* release worm segment information */
	    freetrapchn(lev->lev_traps);
	    free_objchn(lev->objlist);
	    free_objchn(lev->buriedobjlist);
	    free_objchn(lev->billobjs);
	    free_engravings(lev);
	    freedamage(lev);
	    
	    free(lev);
	}

	/* game-state data */
	free_objchn(invent);
	free_objchn(magic_chest_objs);
	free_monchn(migrating_mons);
	free_monchn(mydogs);		/* ascension or dungeon escape */
	free_animals();
	free_oracles();
	freefruitchn();
	freenames();
	free_waterlevel();
	free_dungeon();
	free_history();

	if (iflags.ap_rules) {
	    free(iflags.ap_rules->rules);
	    iflags.ap_rules->rules = NULL;
	    free(iflags.ap_rules);
	}
	iflags.ap_rules = NULL;
	if (iflags.mt_rules) {
	    free(iflags.mt_rules->rules);
	    iflags.mt_rules->rules = NULL;
	    free(iflags.mt_rules);
	    iflags.mt_rules = NULL;
	}
	if (iflags.hp_notify_fmt) {
	    free(iflags.hp_notify_fmt);
	    iflags.hp_notify_fmt = NULL;
	}

	free(artilist);
	free(objects);
	objects = NULL;
	artilist = NULL;
	
	if (active_birth_options)
	    free_optlist(active_birth_options);
	active_birth_options = NULL;
	
	return;
}